

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedCollator::getSortKey
          (RuleBasedCollator *this,UnicodeString *s,uint8_t *dest,int32_t capacity)

{
  uint uVar1;
  int iVar2;
  char16_t *pcVar3;
  int32_t capacity_local;
  uint8_t *dest_local;
  UnicodeString *s_local;
  RuleBasedCollator *this_local;
  
  pcVar3 = UnicodeString::getBuffer(s);
  uVar1 = UnicodeString::length(s);
  iVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x22])
                    (this,pcVar3,(ulong)uVar1,dest,(ulong)(uint)capacity);
  return iVar2;
}

Assistant:

int32_t
RuleBasedCollator::getSortKey(const UnicodeString &s,
                              uint8_t *dest, int32_t capacity) const {
    return getSortKey(s.getBuffer(), s.length(), dest, capacity);
}